

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::post(upnp *this,rootdevice *d,char *soap,char *soap_action)

{
  uint uVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_t sVar4;
  double __x;
  char header [2048];
  
  pcVar2 = (d->path)._M_dataplus._M_p;
  pcVar3 = (d->hostname)._M_dataplus._M_p;
  uVar1 = d->port;
  sVar4 = strlen(soap);
  snprintf(header,0x800,
           "POST %s HTTP/1.1\r\nHost: %s:%d\r\nContent-Type: text/xml; charset=\"utf-8\"\r\nContent-Length: %d\r\nSoapaction: \"%s#%s\"\r\n\r\n%s"
           ,pcVar2,pcVar3,(ulong)uVar1,sVar4,(d->service_namespace)._M_dataplus._M_p,soap_action,
           soap);
  __x = (double)::std::__cxx11::string::assign
                          ((char *)&((d->upnp_connection).
                                     super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_sendbuffer);
  log(this,__x);
  return;
}

Assistant:

void upnp::post(upnp::rootdevice const& d, char const* soap
	, char const* soap_action)
{
	TORRENT_ASSERT(is_single_thread());
	TORRENT_ASSERT(d.magic == 1337);
	TORRENT_ASSERT(d.upnp_connection);
	TORRENT_ASSERT(!d.disabled);

	char header[2048];
	std::snprintf(header, sizeof(header), "POST %s HTTP/1.1\r\n"
		"Host: %s:%d\r\n"
		"Content-Type: text/xml; charset=\"utf-8\"\r\n"
		"Content-Length: %d\r\n"
		"Soapaction: \"%s#%s\"\r\n\r\n"
		"%s"
		, d.path.c_str(), d.hostname.c_str(), d.port
		, int(strlen(soap)), d.service_namespace.c_str(), soap_action
		, soap);

	d.upnp_connection->m_sendbuffer = header;

#ifndef TORRENT_DISABLE_LOGGING
	log("sending: %s", header);
#endif
}